

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall TPZBlockDiagonal<float>::~TPZBlockDiagonal(TPZBlockDiagonal<float> *this)

{
  ~TPZBlockDiagonal(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}